

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O1

void __thiscall TPZMHMixedMeshControl::CreateInternalFluxElements(TPZMHMixedMeshControl *this)

{
  pair<long,_long> *ppVar1;
  TPZGeoMesh *this_00;
  long *plVar2;
  int64_t nelem;
  TPZGeoEl *gel;
  pair<long,_long> *ppVar3;
  ulong uVar4;
  int iVar5;
  mapped_type *this_01;
  TPZGeoEl **ppTVar6;
  TPZCompEl *cel;
  long *plVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  TPZCompMesh *cmeshHDiv;
  TPZManVector<std::pair<long,_long>,_10> MHMOfEachGeoEl;
  TPZCompMesh *local_f8;
  TPZManVector<std::pair<long,_long>,_10> local_f0;
  
  this_00 = ((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer;
  iVar5 = this_00->fDim;
  local_f8 = ((this->fFluxMesh).fRef)->fPointer;
  TPZGeoMesh::ResetReference(this_00);
  TPZCompMesh::LoadReferences(local_f8);
  local_f8->fDimModel = iVar5;
  TPZCreateApproximationSpace::SetAllCreateFunctionsHDiv(&local_f8->fCreate,iVar5);
  local_f8->fDefaultOrder = (this->super_TPZMHMeshControl).fpOrderInternal;
  this_01 = std::
            map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
            ::operator[](&(this->super_TPZMHMeshControl).fConnectToSubDomainIdentifier,&local_f8);
  TPZManVector<long,_10>::Expand(this_01,10000);
  lVar10 = (((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
           super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  if ((this->super_TPZMHMeshControl).fGeoToMHMDomain.super_TPZVec<long>.fNElements == lVar10) {
    TPZManVector<std::pair<long,_long>,_10>::TPZManVector(&local_f0,lVar10);
    ppVar3 = local_f0.super_TPZVec<std::pair<long,_long>_>.fStore;
    if (0 < lVar10) {
      plVar2 = (this->super_TPZMHMeshControl).fGeoToMHMDomain.super_TPZVec<long>.fStore;
      plVar7 = &(local_f0.super_TPZVec<std::pair<long,_long>_>.fStore)->second;
      lVar8 = 0;
      do {
        ((pair<long,_long> *)(plVar7 + -1))->first = plVar2[lVar8];
        *plVar7 = lVar8;
        lVar8 = lVar8 + 1;
        plVar7 = plVar7 + 2;
      } while (lVar10 != lVar8);
    }
    if (lVar10 * 0x10 != 0) {
      ppVar1 = local_f0.super_TPZVec<std::pair<long,_long>_>.fStore + lVar10;
      uVar12 = lVar10 * 0x10 >> 4;
      lVar10 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::__introsort_loop<std::pair<long,long>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_f0.super_TPZVec<std::pair<long,_long>_>.fStore,ppVar1,
                 ((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<std::pair<long,long>*,__gnu_cxx::__ops::_Iter_less_iter>
                (ppVar3,ppVar1);
    }
    if (local_f0.super_TPZVec<std::pair<long,_long>_>.fNElements < 1) {
      lVar10 = -1;
    }
    else {
      lVar10 = -1;
      uVar9 = 0;
      uVar12 = 0xffffffffffffffff;
      do {
        lVar8 = local_f0.super_TPZVec<std::pair<long,_long>_>.fStore[uVar9].first;
        if (lVar8 != -1) {
          nelem = local_f0.super_TPZVec<std::pair<long,_long>_>.fStore[uVar9].second;
          uVar4 = uVar12;
          if (((lVar8 != lVar10) && (bVar13 = lVar10 != -1, uVar4 = uVar9, lVar10 = lVar8, bVar13))
             && ((long)(int)uVar12 < (long)uVar9)) {
            uVar11 = (ulong)(int)uVar12;
            uVar12 = uVar11 << 4 | 8;
            do {
              uVar11 = uVar11 + 1;
              ppTVar6 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                                  (&(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->
                                    fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,
                                   *(int64_t *)
                                    ((long)&(local_f0.super_TPZVec<std::pair<long,_long>_>.fStore)->
                                            first + uVar12));
              (*ppTVar6)->fReference = (TPZCompEl *)0x0;
              uVar12 = uVar12 + 0x10;
            } while ((uVar11 & 0xffffffff) != uVar9);
          }
          uVar12 = uVar4;
          ppTVar6 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                              (&(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec
                                ).super_TPZChunkVector<TPZGeoEl_*,_10>,nelem);
          gel = *ppTVar6;
          if ((gel != (TPZGeoEl *)0x0) &&
             (iVar5 = (**(code **)(*(long *)gel + 0x1d0))(gel), iVar5 == 0)) {
            cel = TPZCreateApproximationSpace::CreateCompEl(&local_f8->fCreate,gel,local_f8);
            TPZMHMeshControl::SetSubdomain(&this->super_TPZMHMeshControl,cel,lVar8);
          }
        }
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < local_f0.super_TPZVec<std::pair<long,_long>_>.fNElements);
      lVar10 = (long)(int)uVar12;
    }
    if (lVar10 < local_f0.super_TPZVec<std::pair<long,_long>_>.fNElements) {
      uVar12 = lVar10 << 4 | 8;
      do {
        ppTVar6 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                            (&(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
                              super_TPZChunkVector<TPZGeoEl_*,_10>,
                             *(int64_t *)
                              ((long)&(local_f0.super_TPZVec<std::pair<long,_long>_>.fStore)->first
                              + uVar12));
        (*ppTVar6)->fReference = (TPZCompEl *)0x0;
        lVar10 = lVar10 + 1;
        uVar12 = uVar12 + 0x10;
      } while (lVar10 < local_f0.super_TPZVec<std::pair<long,_long>_>.fNElements);
    }
    (**(code **)(*(long *)((this->fFluxMesh).fRef)->fPointer + 0x60))();
    if (local_f0.super_TPZVec<std::pair<long,_long>_>.fStore == local_f0.fExtAlloc) {
      local_f0.super_TPZVec<std::pair<long,_long>_>.fStore = (pair<long,_long> *)0x0;
    }
    local_f0.super_TPZVec<std::pair<long,_long>_>.fNAlloc = 0;
    local_f0.super_TPZVec<std::pair<long,_long>_>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01a09130
    ;
    if (local_f0.super_TPZVec<std::pair<long,_long>_>.fStore != (pair<long,_long> *)0x0) {
      operator_delete__(local_f0.super_TPZVec<std::pair<long,_long>_>.fStore);
    }
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
             ,0x3c7);
}

Assistant:

void TPZMHMixedMeshControl::CreateInternalFluxElements() {
    TPZGeoMesh *gmesh = fGMesh.operator->();
    int meshdim = gmesh->Dimension();
    TPZCompMesh *cmeshHDiv = fFluxMesh.operator->();
    gmesh->ResetReference();
    cmeshHDiv->LoadReferences();
    cmeshHDiv->SetDimModel(meshdim);
    cmeshHDiv->ApproxSpace().SetAllCreateFunctionsHDiv(meshdim);
    cmeshHDiv->SetDefaultOrder(fpOrderInternal);

    // Create MHM computational elements
    fConnectToSubDomainIdentifier[cmeshHDiv].Expand(10000);
    int64_t nel = fGMesh->NElements();

    if (fGeoToMHMDomain.size() != nel) DebugStop();

    TPZManVector<std::pair<int64_t, int64_t>> MHMOfEachGeoEl(nel);
    for (int i = 0; i < nel; i++) {
        MHMOfEachGeoEl[i] = std::make_pair(fGeoToMHMDomain[i], i);
    }

    std::sort(&MHMOfEachGeoEl[0], &MHMOfEachGeoEl[nel - 1] + 1);

    int64_t previousMHMDomain = -1;
    int64_t firstElemInMHMDomain = -1;
    for (int i = 0; i < MHMOfEachGeoEl.size(); i++) {
        int64_t MHMDomain = MHMOfEachGeoEl[i].first;
        int64_t elIndex = MHMOfEachGeoEl[i].second;

        if (MHMDomain == -1) continue;

        if (MHMDomain != previousMHMDomain) {
            if (previousMHMDomain != -1) {
                for (int j = firstElemInMHMDomain; j < i; j++) {
                    fGMesh->Element(MHMOfEachGeoEl[j].second)->ResetReference();
                }
            }
            firstElemInMHMDomain = i;
            previousMHMDomain = MHMDomain;
        }

        // Create the flux element
        TPZGeoEl *gel = fGMesh->Element(elIndex);
        if (!gel || gel->HasSubElement()) continue;
        TPZCompEl* cel = cmeshHDiv->CreateCompEl(gel);
//        TPZCompEl *cel = cmeshHDiv->Element(index);
        // Associate the connects with the subdomain for the flux mesh
        SetSubdomain(cel, MHMDomain);
    }
    // Resets references of last MHM domain
    for (int j = firstElemInMHMDomain; j < MHMOfEachGeoEl.size(); j++) {
        fGMesh->Element(MHMOfEachGeoEl[j].second)->ResetReference();
    }

    fFluxMesh->ExpandSolution();
}